

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int dbg_print(int format,FILE *target,void *data,int len,int sep)

{
  uint uVar1;
  
  switch(format) {
  case 0:
    fputs((char *)data,(FILE *)target);
    break;
  case 3:
    data = *data;
  case 2:
  case 4:
    fprintf((FILE *)target,"%ld",data);
    break;
  case 5:
    uVar1 = *data;
    if ((int)uVar1 < 0) {
      fputc(0x2d,(FILE *)target);
      uVar1 = -uVar1;
    }
    fprintf((FILE *)target,"%d.%02d",(ulong)uVar1 / 100,(ulong)(uVar1 % 100));
    break;
  case 6:
    fputc((int)*data,(FILE *)target);
  }
  fputc(0x7c,(FILE *)target);
  return 0;
}

Assistant:

int
dbg_print(int format, FILE *target, void *data, int len, int sep)
{
	int dollars,
		cents;
#ifndef MVS
	UNUSED(len);
#endif

	switch(format)
	{
	case DT_STR:
#ifdef DOUBLE_QUOTE_OUTPUT_STRINGS
		fprintf(target, "\"%s\"", (char *)data);
#else
		fprintf(target, "%s", (char *)data);
#endif
		break;
#ifdef MVS
	case DT_VSTR:
		/* note: only used in MVS, assumes columnar output */
		fprintf(target, "%c%c%-*s", 
			(len >> 8) & 0xFF, len & 0xFF, len, (char *)data);
		break;
#endif /* MVS */
	case DT_INT:
		fprintf(target, "%ld", (long)((size_t)data));
		break;
	case DT_HUGE:
		fprintf(target, HUGE_FORMAT, *(DSS_HUGE *)data);
		break;
	case DT_KEY:
		fprintf(target, "%ld", (long)((size_t)data));
		break;
	case DT_MONEY:
		cents = (int)*(DSS_HUGE *)data;
		if (cents < 0)
			{
			fprintf(target, "-");
			cents = -cents;
			}
		dollars = cents / 100;
		cents %= 100;
		fprintf(target, "%d.%02d", dollars, cents);
		break;
	case DT_CHR:
		fprintf(target, "%c", *(char *)data);
		break;
	}

#ifdef EOL_HANDLING
	if (sep)
#else
	UNUSED(sep);
#endif /* EOL_HANDLING */
	fprintf(target, "%c", SEPARATOR);
	
	return(0);
}